

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O3

bool testing::internal::LogIsVisible(LogSeverity severity)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((char *)&FLAGS_gmock_verbose_abi_cxx11_);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&FLAGS_gmock_verbose_abi_cxx11_);
    bVar1 = severity == kWarning && iVar2 != 0;
  }
  return bVar1;
}

Assistant:

GTEST_API_ bool LogIsVisible(LogSeverity severity) {
  if (GMOCK_FLAG_GET(verbose) == kInfoVerbosity) {
    // Always show the log if --gmock_verbose=info.
    return true;
  } else if (GMOCK_FLAG_GET(verbose) == kErrorVerbosity) {
    // Always hide it if --gmock_verbose=error.
    return false;
  } else {
    // If --gmock_verbose is neither "info" nor "error", we treat it
    // as "warning" (its default value).
    return severity == kWarning;
  }
}